

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O1

void __thiscall Lodtalk::StackInterpreter::interpretSpecialMessageBitAnd(StackInterpreter *this)

{
  ulong *puVar1;
  ulong uVar2;
  size_t sVar3;
  Oop selector;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  
  puVar1 = (ulong *)(this->stack->stackFrame).stackPointer;
  uVar5 = *puVar1;
  uVar2 = puVar1[1];
  uVar4 = (uint)uVar5;
  uVar6 = (uint)uVar2;
  if ((uVar4 & uVar6 & 1) == 0) {
    if ((uVar4 & 7) != 2 || (uVar6 & 7) != 2) {
      selector = VMContext::getSpecialMessageSelector(this->context,BitAnd);
      sendSelectorArgumentCount(this,selector,1,false);
      return;
    }
    sVar3 = this->pc;
    this->pc = sVar3 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar3);
    uVar5 = (ulong)(int)(uVar6 & uVar4);
  }
  else {
    sVar3 = this->pc;
    this->pc = sVar3 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar3);
    uVar5 = uVar5 & uVar2;
  }
  (this->stack->stackFrame).stackPointer = (uint8_t *)(puVar1 + 1);
  puVar1[1] = uVar5;
  return;
}

Assistant:

void interpretSpecialMessageBitAnd()
    {
        Oop a = stackOopAt(1);
        Oop b = stackOopAt(0);

        if(a.isSmallInteger() && b.isSmallInteger())
        {
            fetchNextInstructionOpcode();
            popMultiplesOops(2);

            auto ia = a.decodeSmallInteger();
            auto ib = b.decodeSmallInteger();
            pushOop(Oop::encodeSmallInteger(ia & ib));
        }
        else if(a.isCharacter() && b.isCharacter())
        {
            fetchNextInstructionOpcode();
            popMultiplesOops(2);

            auto ca = a.decodeCharacter();
            auto cb = b.decodeCharacter();
            pushOop(Oop::encodeCharacter(ca & cb));
        }
        else
        {
            sendSpecialArgumentCount(SpecialMessageSelector::BitAnd, 1);
        }
    }